

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LIRMIA3.h
# Opt level: O2

int SetAllPWMsLIRMIA3(LIRMIA3 *pLIRMIA3,int *pws)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uchar M1;
  int iVar4;
  long lVar5;
  uchar M4;
  int pws_tmp [4];
  
  pws_tmp._0_8_ = *(undefined8 *)pws;
  pws_tmp._8_8_ = *(undefined8 *)(pws + 2);
  for (lVar5 = 0; lVar5 != 0x10; lVar5 = lVar5 + 4) {
    iVar1 = (int)((double)(*(int *)((long)pws_tmp + lVar5) + -0x5dc) *
                 *(double *)((long)pLIRMIA3->CoefPWs + lVar5 * 2));
    if (*(int *)((long)pLIRMIA3->bProportionalPWs + lVar5) == 0) {
      iVar1 = iVar1 + 0x5dc;
    }
    else {
      iVar2 = *(int *)((long)pLIRMIA3->MidPWs + lVar5);
      if (iVar1 < 0) {
        iVar1 = ((*(int *)((long)pLIRMIA3->MinPWs + lVar5) - iVar2) * iVar1) / -500;
      }
      else {
        iVar1 = ((*(int *)((long)pLIRMIA3->MaxPWs + lVar5) - iVar2) * iVar1) / 500;
      }
      iVar1 = iVar1 + iVar2;
    }
    iVar2 = *(int *)((long)pLIRMIA3->MinPWs + lVar5);
    iVar3 = *(int *)((long)pLIRMIA3->MaxPWs + lVar5);
    if (iVar1 < iVar3) {
      iVar3 = iVar1;
    }
    if (iVar3 <= iVar2) {
      iVar3 = iVar2;
    }
    *(int *)((long)pws_tmp + lVar5) = iVar3;
  }
  iVar4 = (pws_tmp[0] * 0xff + -0x3e418) / 1000;
  iVar3 = (pws_tmp[1] * 0xff + -0x3e418) / 1000;
  iVar1 = (pws_tmp[2] * 0xff + -0x3e418) / 1000;
  iVar2 = (pws_tmp[3] * 0xff + -0x3e418) / 1000;
  if (0xfe < iVar4) {
    iVar4 = 0xff;
  }
  M1 = (uchar)iVar4;
  if (iVar4 < 1) {
    M1 = '\0';
  }
  if (0xfe < iVar3) {
    iVar3 = 0xff;
  }
  if (iVar3 < 1) {
    iVar3 = 0;
  }
  if (0xfe < iVar1) {
    iVar1 = 0xff;
  }
  if (iVar1 < 1) {
    iVar1 = 0;
  }
  iVar4 = 0xff;
  if (iVar2 < 0xff) {
    iVar4 = iVar2;
  }
  M4 = (uchar)iVar4;
  if (iVar4 < 1) {
    M4 = '\0';
  }
  iVar1 = WriteDataLIRMIA3(pLIRMIA3,M1,(uchar)iVar3,(uchar)iVar1,M4);
  if (iVar1 == 0) {
    iVar1 = 0;
    for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
      pLIRMIA3->LastPWs[lVar5] = pws_tmp[lVar5];
    }
  }
  else {
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

inline int SetAllPWMsLIRMIA3(LIRMIA3* pLIRMIA3, int* pws)
{
	int channel = 0;
	int pws_tmp[NB_CHANNELS_PWM_LIRMIA3];
	int M1 = 0, M2 = 0, M3 = 0, M4 = 0;

	memcpy(pws_tmp, pws, sizeof(pws_tmp));

	for (channel = 0; channel < NB_CHANNELS_PWM_LIRMIA3; channel++)
	{
		if (pLIRMIA3->bProportionalPWs[channel])
		{
			pws_tmp[channel] = (int)(pLIRMIA3->CoefPWs[channel]*(pws_tmp[channel]-DEFAULT_MID_PW_LIRMIA3));
			if (pws_tmp[channel] >= 0)
				pws_tmp[channel] = pLIRMIA3->MidPWs[channel]+pws_tmp[channel]*(pLIRMIA3->MaxPWs[channel]-pLIRMIA3->MidPWs[channel])
				/(DEFAULT_MAX_PW_LIRMIA3-DEFAULT_MID_PW_LIRMIA3);
			else
				pws_tmp[channel] = pLIRMIA3->MidPWs[channel]+pws_tmp[channel]*(pLIRMIA3->MinPWs[channel]-pLIRMIA3->MidPWs[channel])
				/(DEFAULT_MIN_PW_LIRMIA3-DEFAULT_MID_PW_LIRMIA3);
		}
		else
		{
			pws_tmp[channel] = DEFAULT_MID_PW_LIRMIA3+(int)(pLIRMIA3->CoefPWs[channel]*(pws_tmp[channel]-DEFAULT_MID_PW_LIRMIA3));
		}

		pws_tmp[channel] = max(min(pws_tmp[channel], pLIRMIA3->MaxPWs[channel]), pLIRMIA3->MinPWs[channel]);
		//pws_tmp[channel] = max(min(pws_tmp[channel], DEFAULT_ABSOLUTE_MAX_PW_LIRMIA3), DEFAULT_ABSOLUTE_MIN_PW_LIRMIA3);

		//// The requested PWM is only applied if it is slightly different from the current value.
		//if (abs(pws_tmp[channel]-pLIRMIA3->LastPWs[channel]) < pLIRMIA3->ThresholdPWs[channel]) continue;

		//printf("%d %d %d %d %d\n", channel, pws_tmp[channel], pLIRMIA3->LastPWs[channel], abs(pws_tmp[channel]-pLIRMIA3->LastPWs[channel]), pLIRMIA3->ThresholdPWs[channel]);
	}

	//M1 = (pws_tmp[0]-pLIRMIA3->MinPWs[0])*255/(pLIRMIA3->MaxPWs[0]-pLIRMIA3->MinPWs[0]); 
	//M2 = (pws_tmp[1]-pLIRMIA3->MinPWs[1])*255/(pLIRMIA3->MaxPWs[1]-pLIRMIA3->MinPWs[1]); 
	//M3 = (pws_tmp[2]-pLIRMIA3->MinPWs[2])*255/(pLIRMIA3->MaxPWs[2]-pLIRMIA3->MinPWs[2]); 
	//M4 = (pws_tmp[3]-pLIRMIA3->MinPWs[3])*255/(pLIRMIA3->MaxPWs[3]-pLIRMIA3->MinPWs[3]);
	M1 = (pws_tmp[0]-1000)*255/1000; 
	M2 = (pws_tmp[1]-1000)*255/1000; 
	M3 = (pws_tmp[2]-1000)*255/1000; 
	M4 = (pws_tmp[3]-1000)*255/1000;

	M1 = max(min(M1, 255), 0);
	M2 = max(min(M2, 255), 0);
	M3 = max(min(M3, 255), 0);
	M4 = max(min(M4, 255), 0);

	if (WriteDataLIRMIA3(pLIRMIA3, (unsigned char)M1, (unsigned char)M2, (unsigned char)M3, (unsigned char)M4) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	for (channel = 0; channel < NB_CHANNELS_PWM_LIRMIA3; channel++)
	{
		//// The requested PWM should have been only applied if it was slightly different from the current value.
		//if (abs(pws_tmp[channel]-pLIRMIA3->LastPWs[channel]) < pLIRMIA3->ThresholdPWs[channel]) continue;

		// Update last known value.
		pLIRMIA3->LastPWs[channel] = pws_tmp[channel];
	}

	return EXIT_SUCCESS;
}